

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O1

aiMesh * Assimp::StandardShapes::MakeMesh
                   (_func_uint_vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_ptr_bool
                    *GenerateFunc)

{
  uint numIndices;
  aiMesh *paVar1;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> temp;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_28;
  
  local_28.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  numIndices = (*GenerateFunc)(&local_28,true);
  paVar1 = MakeMesh(&local_28,numIndices);
  if (local_28.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return paVar1;
}

Assistant:

aiMesh* StandardShapes::MakeMesh ( unsigned int (*GenerateFunc)(
    std::vector<aiVector3D>&, bool))
{
    std::vector<aiVector3D> temp;
    unsigned num = (*GenerateFunc)(temp,true);
    return MakeMesh(temp,num);
}